

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.c
# Opt level: O0

CURLcode req_flush(Curl_easy *data)

{
  _Bool _Var1;
  CURLcode CVar2;
  _Bool local_29;
  _Bool done;
  size_t nwritten;
  char tmp;
  Curl_easy *pCStack_18;
  CURLcode result;
  Curl_easy *data_local;
  
  if ((data == (Curl_easy *)0x0) || (data->conn == (connectdata *)0x0)) {
    return CURLE_FAILED_INIT;
  }
  pCStack_18 = data;
  _Var1 = Curl_bufq_is_empty(&(data->req).sendbuf);
  if (_Var1) {
    _Var1 = Curl_xfer_needs_flush(pCStack_18);
    if (_Var1) {
      CVar2 = Curl_xfer_flush(pCStack_18);
      return CVar2;
    }
  }
  else {
    nwritten._4_4_ = req_send_buffer_flush(pCStack_18);
    if (nwritten._4_4_ != CURLE_OK) {
      return nwritten._4_4_;
    }
    _Var1 = Curl_bufq_is_empty(&(pCStack_18->req).sendbuf);
    if (!_Var1) {
      return CURLE_AGAIN;
    }
  }
  if (((*(uint *)&(pCStack_18->req).field_0xd9 >> 5 & 1) != 0) &&
     ((*(uint *)&(pCStack_18->req).field_0xd9 >> 6 & 1) == 0)) {
    CVar2 = xfer_send(pCStack_18,(char *)((long)&nwritten + 3),0,0,
                      (size_t *)&stack0xffffffffffffffd8);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    nwritten._4_4_ = CURLE_OK;
  }
  if ((((*(uint *)&(pCStack_18->req).field_0xd9 >> 8 & 1) == 0) &&
      ((*(uint *)&(pCStack_18->req).field_0xd9 >> 5 & 1) != 0)) &&
     ((*(uint *)&(pCStack_18->req).field_0xd9 >> 6 & 1) != 0)) {
    if ((*(uint *)&(pCStack_18->req).field_0xd9 >> 0x14 & 1) != 0) {
      CVar2 = Curl_xfer_send_shutdown(pCStack_18,&local_29);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
      if ((local_29 & 1U) == 0) {
        return CURLE_AGAIN;
      }
      nwritten._4_4_ = CURLE_OK;
    }
    CVar2 = Curl_req_set_upload_done(pCStack_18);
    return CVar2;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode req_flush(struct Curl_easy *data)
{
  CURLcode result;

  if(!data || !data->conn)
    return CURLE_FAILED_INIT;

  if(!Curl_bufq_is_empty(&data->req.sendbuf)) {
    result = req_send_buffer_flush(data);
    if(result)
      return result;
    if(!Curl_bufq_is_empty(&data->req.sendbuf)) {
      DEBUGF(infof(data, "Curl_req_flush(len=%zu) -> EAGAIN",
             Curl_bufq_len(&data->req.sendbuf)));
      return CURLE_AGAIN;
    }
  }
  else if(Curl_xfer_needs_flush(data)) {
    DEBUGF(infof(data, "Curl_req_flush(), xfer send_pending"));
    return Curl_xfer_flush(data);
  }

  if(data->req.eos_read && !data->req.eos_sent) {
    char tmp;
    size_t nwritten;
    result = xfer_send(data, &tmp, 0, 0, &nwritten);
    if(result)
      return result;
    DEBUGASSERT(data->req.eos_sent);
  }

  if(!data->req.upload_done && data->req.eos_read && data->req.eos_sent) {
    DEBUGASSERT(Curl_bufq_is_empty(&data->req.sendbuf));
    if(data->req.shutdown) {
      bool done;
      result = Curl_xfer_send_shutdown(data, &done);
      if(result)
        return result;
      if(!done)
        return CURLE_AGAIN;
    }
    return Curl_req_set_upload_done(data);
  }
  return CURLE_OK;
}